

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::free
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,void *__ptr)

{
  KeyVal *this_00;
  Data *pDVar1;
  int n;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> *this_local;
  
  this_00 = this->_a;
  pDVar1 = d(this);
  asl_destroy<asl::Map<asl::String,asl::String>::KeyVal>
            ((asl *)this_00,(KeyVal *)(ulong)(uint)pDVar1->n,n);
  ::free(&this->_a[-1].value.field_2);
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}